

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * dumptxoutset(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffeb78;
  allocator<RPCArg> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffeb80;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffeb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebb0;
  allocator<char> *in_stack_ffffffffffffebb8;
  iterator in_stack_ffffffffffffebc0;
  RPCArgOptions *in_stack_ffffffffffffebc8;
  string *in_stack_ffffffffffffebd0;
  undefined7 in_stack_ffffffffffffebd8;
  undefined1 in_stack_ffffffffffffebdf;
  undefined4 in_stack_ffffffffffffebe0;
  Type in_stack_ffffffffffffebe4;
  string *in_stack_ffffffffffffebe8;
  undefined4 in_stack_ffffffffffffebf0;
  Type in_stack_ffffffffffffebf4;
  undefined4 in_stack_ffffffffffffebf8;
  Type in_stack_ffffffffffffebfc;
  RPCArg *in_stack_ffffffffffffec00;
  RPCArgOptions *in_stack_ffffffffffffec20;
  undefined1 *local_13c0;
  undefined1 *local_13a8;
  undefined1 *local_1390;
  undefined1 *local_1378;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_1120 [34];
  allocator<char> local_10fe;
  allocator<char> local_10fd;
  allocator<char> local_10fc;
  allocator<char> local_10fb;
  undefined1 local_10fa [2];
  vector<RPCArg,_std::allocator<RPCArg>_> local_10f8;
  undefined1 local_10da;
  undefined1 local_10d9 [32];
  allocator<char> local_10b9 [31];
  allocator<char> local_109a;
  allocator<char> local_1099 [31];
  allocator<char> local_107a;
  allocator<char> local_1079;
  size_type local_1078;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1070;
  allocator<char> local_105a;
  allocator<char> local_1059;
  _Alloc_hider local_1058;
  size_type sStack_1050;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1048;
  allocator<char> local_1032;
  allocator<char> local_1031 [31];
  allocator<char> local_1012;
  allocator<char> local_1011 [17];
  undefined8 local_1000;
  allocator<char> local_ff3;
  allocator<char> local_ff2;
  undefined1 local_ff1 [40];
  allocator<char> local_fc9;
  undefined4 local_fc8;
  allocator<char> local_fc4;
  allocator<char> local_fc3;
  allocator<char> local_fc2;
  allocator<char> local_fc1;
  undefined4 local_fc0;
  allocator<char> local_fb9 [31];
  allocator<char> local_f9a;
  allocator<char> local_f99 [769];
  undefined1 local_c98 [680];
  string local_9f0 [4];
  undefined1 local_968 [200];
  allocator<RPCArg> local_8a0 [40];
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined1 local_860;
  undefined1 local_85f;
  undefined1 local_858 [64];
  undefined1 local_818 [64];
  undefined1 local_7d8;
  undefined1 local_7d7;
  undefined1 local_730 [264];
  undefined1 local_628 [160];
  undefined1 local_588;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined1 local_548;
  undefined1 local_547;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_fc0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb88,&in_stack_ffffffffffffeb80->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffeb90);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb78);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
                 in_stack_ffffffffffffebe8,in_stack_ffffffffffffebe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                 in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            ((UniValue *)in_stack_ffffffffffffebc0,(char (*) [1])in_stack_ffffffffffffebb8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_588 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffeb90);
  local_560 = 0;
  uStack_558 = 0;
  local_550 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb78);
  local_548 = 0;
  local_547 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
                 in_stack_ffffffffffffebe8,in_stack_ffffffffffffebe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                 in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_fc8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb88,&in_stack_ffffffffffffeb80->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_ff1._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb88,&in_stack_ffffffffffffeb80->typ);
  fun = (RPCMethodImpl *)local_ff1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_818[0] = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffeb90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffeb78);
  __l._M_len = (size_type)in_stack_ffffffffffffebc8;
  __l._M_array = &in_stack_ffffffffffffebc0->m_names;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffebb8,__l,(allocator_type *)in_stack_ffffffffffffebb0);
  local_7d8 = 0;
  local_7d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
                 in_stack_ffffffffffffebe8,in_stack_ffffffffffffebe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                 in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffeb78);
  __l_00._M_len = (size_type)in_stack_ffffffffffffebc8;
  __l_00._M_array = in_stack_ffffffffffffebc0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffebb8,__l_00,
             (allocator_type *)in_stack_ffffffffffffebb0);
  local_8a0[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffeb90);
  local_878 = 0;
  uStack_870 = 0;
  local_868 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb78);
  local_860 = 0;
  local_85f = 0;
  this = local_8a0;
  RPCArg::RPCArg(in_stack_ffffffffffffec00,
                 (string *)CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8),
                 in_stack_ffffffffffffebf4,(Fallback *)in_stack_ffffffffffffebe8,
                 (string *)CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
                 in_stack_ffffffffffffec20);
  std::allocator<RPCArg>::allocator(this);
  __l_01._M_len = (size_type)in_stack_ffffffffffffebc8;
  __l_01._M_array = in_stack_ffffffffffffebc0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffebb8,__l_01,
             (allocator_type *)in_stack_ffffffffffffebb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_1058._M_p = (pointer)0x0;
  sStack_1050 = 0;
  local_1048._M_allocated_capacity = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,
             (string *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
             in_stack_ffffffffffffebe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
             (bool)in_stack_ffffffffffffebdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_1078 = 0;
  aStack_1070._M_allocated_capacity = 0;
  aStack_1070._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,
             (string *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
             in_stack_ffffffffffffebe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
             (bool)in_stack_ffffffffffffebdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_1099._1_8_ = 0;
  local_1099._9_8_ = 0;
  local_1099[0x11] = (allocator<char>)0x0;
  local_1099[0x12] = (allocator<char>)0x0;
  local_1099[0x13] = (allocator<char>)0x0;
  local_1099[0x14] = (allocator<char>)0x0;
  local_1099[0x15] = (allocator<char>)0x0;
  local_1099[0x16] = (allocator<char>)0x0;
  local_1099[0x17] = (allocator<char>)0x0;
  local_1099[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,
             (string *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
             in_stack_ffffffffffffebe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
             (bool)in_stack_ffffffffffffebdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_10b9[1] = (allocator<char>)0x0;
  local_10b9[2] = (allocator<char>)0x0;
  local_10b9[3] = (allocator<char>)0x0;
  local_10b9[4] = (allocator<char>)0x0;
  local_10b9[5] = (allocator<char>)0x0;
  local_10b9[6] = (allocator<char>)0x0;
  local_10b9[7] = (allocator<char>)0x0;
  local_10b9[8] = (allocator<char>)0x0;
  local_10b9._9_8_ = 0;
  local_10b9._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,
             (string *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
             in_stack_ffffffffffffebe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
             (bool)in_stack_ffffffffffffebdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_10d9._1_8_ = 0;
  local_10d9._9_8_ = 0;
  local_10d9._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,
             (string *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
             in_stack_ffffffffffffebe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
             (bool)in_stack_ffffffffffffebdf);
  name = local_9f0;
  this_01 = (RPCHelpMan *)local_10d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  description = (string *)&local_10da;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  local_10f8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_10f8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_10f8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  args = &local_10f8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,
             (string *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
             in_stack_ffffffffffffebe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
             (bool)in_stack_ffffffffffffebdf);
  results = (RPCResults *)(local_10fa + 1);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_02._M_len = (size_type)in_stack_ffffffffffffebc8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffebc0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffebb8,__l_02,
             (allocator_type *)in_stack_ffffffffffffebb0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,
             (string *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
             in_stack_ffffffffffffebe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebe4,in_stack_ffffffffffffebe0),
             (bool)in_stack_ffffffffffffebdf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0));
  examples = (RPCExamples *)local_10fa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  HelpExampleCli(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  HelpExampleCli(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
  std::operator+(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebc8,(char *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  HelpExampleCli(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
  std::operator+(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x56ba95);
  this_00 = (RPCArg *)local_1120;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<dumptxoutset()::__0,void>
            (in_stack_ffffffffffffeb88,(anon_class_1_0_00000001 *)in_stack_ffffffffffffeb80);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1120 + 0x21));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_10fe);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_10fd);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_10fc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_10fb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_10fa);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1378 = local_968;
  do {
    local_1378 = local_1378 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1378 != local_c98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_10da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_10d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_10d9 + 0x1f));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_10b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_109a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1099);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_107a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1079);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_105a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1059);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1032);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1031);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1012);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1011);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1390 = local_48;
  do {
    local_1390 = local_1390 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1390 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_13a8 = local_628;
  do {
    local_13a8 = local_13a8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_13a8 != local_730);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  local_13c0 = local_818;
  do {
    local_13c0 = local_13c0 + -0x20;
    std::__cxx11::string::~string(&this_00->m_names);
  } while (local_13c0 != local_858);
  std::allocator<char>::~allocator(&local_ff3);
  std::allocator<char>::~allocator(&local_ff2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_ff1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_ff1 + 8));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fc9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fc4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fc3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fc2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fc1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_fb9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f9a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_f99);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan dumptxoutset()
{
    return RPCHelpMan{
        "dumptxoutset",
        "Write the serialized UTXO set to a file. This can be used in loadtxoutset afterwards if this snapshot height is supported in the chainparams as well.\n\n"
        "Unless the the \"latest\" type is requested, the node will roll back to the requested height and network activity will be suspended during this process. "
        "Because of this it is discouraged to interact with the node in any other way during the execution of this call to avoid inconsistent results and race conditions, particularly RPCs that interact with blockstorage.\n\n"
        "This call may take several minutes. Make sure to use no RPC timeout (bitcoin-cli -rpcclienttimeout=0)",
        {
            {"path", RPCArg::Type::STR, RPCArg::Optional::NO, "Path to the output file. If relative, will be prefixed by datadir."},
            {"type", RPCArg::Type::STR, RPCArg::Default(""), "The type of snapshot to create. Can be \"latest\" to create a snapshot of the current UTXO set or \"rollback\" to temporarily roll back the state of the node to a historical block before creating the snapshot of a historical UTXO set. This parameter can be omitted if a separate \"rollback\" named parameter is specified indicating the height or hash of a specific historical block. If \"rollback\" is specified and separate \"rollback\" named parameter is not specified, this will roll back to the latest valid snapshot block that can currently be loaded with loadtxoutset."},
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                {
                    {"rollback", RPCArg::Type::NUM, RPCArg::Optional::OMITTED,
                        "Height or hash of the block to roll back to before creating the snapshot. Note: The further this number is from the tip, the longer this process will take. Consider setting a higher -rpcclienttimeout value in this case.",
                    RPCArgOptions{.skip_type_check = true, .type_str = {"", "string or numeric"}}},
                },
            },
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::NUM, "coins_written", "the number of coins written in the snapshot"},
                    {RPCResult::Type::STR_HEX, "base_hash", "the hash of the base of the snapshot"},
                    {RPCResult::Type::NUM, "base_height", "the height of the base of the snapshot"},
                    {RPCResult::Type::STR, "path", "the absolute path that the snapshot was written to"},
                    {RPCResult::Type::STR_HEX, "txoutset_hash", "the hash of the UTXO set contents"},
                    {RPCResult::Type::NUM, "nchaintx", "the number of transactions in the chain up to and including the base block"},
                }
        },
        RPCExamples{
            HelpExampleCli("-rpcclienttimeout=0 dumptxoutset", "utxo.dat latest") +
            HelpExampleCli("-rpcclienttimeout=0 dumptxoutset", "utxo.dat rollback") +
            HelpExampleCli("-rpcclienttimeout=0 -named dumptxoutset", R"(utxo.dat rollback=853456)")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CBlockIndex* tip{WITH_LOCK(::cs_main, return node.chainman->ActiveChain().Tip())};
    const CBlockIndex* target_index{nullptr};
    const std::string snapshot_type{self.Arg<std::string>("type")};
    const UniValue options{request.params[2].isNull() ? UniValue::VOBJ : request.params[2]};
    if (options.exists("rollback")) {
        if (!snapshot_type.empty() && snapshot_type != "rollback") {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid snapshot type \"%s\" specified with rollback option", snapshot_type));
        }
        target_index = ParseHashOrHeight(options["rollback"], *node.chainman);
    } else if (snapshot_type == "rollback") {
        auto snapshot_heights = node.chainman->GetParams().GetAvailableSnapshotHeights();
        CHECK_NONFATAL(snapshot_heights.size() > 0);
        auto max_height = std::max_element(snapshot_heights.begin(), snapshot_heights.end());
        target_index = ParseHashOrHeight(*max_height, *node.chainman);
    } else if (snapshot_type == "latest") {
        target_index = tip;
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid snapshot type \"%s\" specified. Please specify \"rollback\" or \"latest\"", snapshot_type));
    }

    const ArgsManager& args{EnsureAnyArgsman(request.context)};
    const fs::path path = fsbridge::AbsPathJoin(args.GetDataDirNet(), fs::u8path(request.params[0].get_str()));
    // Write to a temporary path and then move into `path` on completion
    // to avoid confusion due to an interruption.
    const fs::path temppath = fsbridge::AbsPathJoin(args.GetDataDirNet(), fs::u8path(request.params[0].get_str() + ".incomplete"));

    if (fs::exists(path)) {
        throw JSONRPCError(
            RPC_INVALID_PARAMETER,
            path.utf8string() + " already exists. If you are sure this is what you want, "
            "move it out of the way first");
    }

    FILE* file{fsbridge::fopen(temppath, "wb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        throw JSONRPCError(
            RPC_INVALID_PARAMETER,
            "Couldn't open file " + temppath.utf8string() + " for writing.");
    }

    CConnman& connman = EnsureConnman(node);
    const CBlockIndex* invalidate_index{nullptr};
    std::optional<NetworkDisable> disable_network;
    std::optional<TemporaryRollback> temporary_rollback;

    // If the user wants to dump the txoutset of the current tip, we don't have
    // to roll back at all
    if (target_index != tip) {
        // If the node is running in pruned mode we ensure all necessary block
        // data is available before starting to roll back.
        if (node.chainman->m_blockman.IsPruneMode()) {
            LOCK(node.chainman->GetMutex());
            const CBlockIndex* current_tip{node.chainman->ActiveChain().Tip()};
            const CBlockIndex* first_block{node.chainman->m_blockman.GetFirstBlock(*current_tip, /*status_mask=*/BLOCK_HAVE_MASK)};
            if (first_block->nHeight > target_index->nHeight) {
                throw JSONRPCError(RPC_MISC_ERROR, "Could not roll back to requested height since necessary block data is already pruned.");
            }
        }

        // Suspend network activity for the duration of the process when we are
        // rolling back the chain to get a utxo set from a past height. We do
        // this so we don't punish peers that send us that send us data that
        // seems wrong in this temporary state. For example a normal new block
        // would be classified as a block connecting an invalid block.
        // Skip if the network is already disabled because this
        // automatically re-enables the network activity at the end of the
        // process which may not be what the user wants.
        if (connman.GetNetworkActive()) {
            disable_network.emplace(connman);
        }

        invalidate_index = WITH_LOCK(::cs_main, return node.chainman->ActiveChain().Next(target_index));
        temporary_rollback.emplace(*node.chainman, *invalidate_index);
    }

    Chainstate* chainstate;
    std::unique_ptr<CCoinsViewCursor> cursor;
    CCoinsStats stats;
    {
        // Lock the chainstate before calling PrepareUtxoSnapshot, to be able
        // to get a UTXO database cursor while the chain is pointing at the
        // target block. After that, release the lock while calling
        // WriteUTXOSnapshot. The cursor will remain valid and be used by
        // WriteUTXOSnapshot to write a consistent snapshot even if the
        // chainstate changes.
        LOCK(node.chainman->GetMutex());
        chainstate = &node.chainman->ActiveChainstate();
        // In case there is any issue with a block being read from disk we need
        // to stop here, otherwise the dump could still be created for the wrong
        // height.
        // The new tip could also not be the target block if we have a stale
        // sister block of invalidate_index. This block (or a descendant) would
        // be activated as the new tip and we would not get to new_tip_index.
        if (target_index != chainstate->m_chain.Tip()) {
            LogWarning("dumptxoutset failed to roll back to requested height, reverting to tip.\n");
            throw JSONRPCError(RPC_MISC_ERROR, "Could not roll back to requested height.");
        } else {
            std::tie(cursor, stats, tip) = PrepareUTXOSnapshot(*chainstate, node.rpc_interruption_point);
        }
    }

    UniValue result = WriteUTXOSnapshot(*chainstate, cursor.get(), &stats, tip, afile, path, temppath, node.rpc_interruption_point);
    fs::rename(temppath, path);

    result.pushKV("path", path.utf8string());
    return result;
},
    };
}